

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O3

void __thiscall
lsim::ModelCircuit::change_port_pin_count(ModelCircuit *this,uint32_t comp_id,uint32_t new_count)

{
  ModelComponent *this_00;
  iterator iVar1;
  pin_id_t pin;
  uint index;
  key_type local_24;
  
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_components)._M_h,&local_24);
  if ((iVar1.
       super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (this_00 = *(ModelComponent **)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false>
                        ._M_cur + 0x10), this_00 != (ModelComponent *)0x0)) {
    index = this_00->m_outputs + this_00->m_inputs;
    while (new_count < index) {
      index = index - 1;
      pin = ModelComponent::pin_id(this_00,index);
      disconnect_pin(this,pin);
    }
    if (this_00->m_type == 1) {
      ModelComponent::change_output_pins(this_00,new_count);
    }
    else {
      ModelComponent::change_input_pins(this_00,new_count);
    }
    rebuild_port_list(this);
    return;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_circuit.cpp"
                ,0x103,"void lsim::ModelCircuit::change_port_pin_count(uint32_t, uint32_t)");
}

Assistant:

void ModelCircuit::change_port_pin_count(uint32_t comp_id, uint32_t new_count) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    // disconnect any ports that are going to be removed
    auto cur_count = comp->num_inputs() + comp->num_outputs();
    while (cur_count > new_count) {
        disconnect_pin(comp->pin_id(--cur_count));
    }

    if (comp->type() == COMPONENT_CONNECTOR_IN) {
        comp->change_output_pins(new_count);
    } else {
        comp->change_input_pins(new_count);
    }

    rebuild_port_list();
}